

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O2

void __thiscall TestCase::~TestCase(TestCase *this)

{
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_00108d38;
  std::__cxx11::string::~string((string *)&this->mErrorString);
  std::__cxx11::string::~string((string *)&this->mFilename);
  Mutex::~Mutex(&this->mMutex);
  JHThread::Thread::~Thread(&(this->mThread).super_Thread);
  std::__cxx11::string::~string((string *)&this->mTestName);
  return;
}

Assistant:

virtual ~TestCase() 
	{
	}